

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O3

string * getLinuxFolderDefault_abi_cxx11_
                   (string *__return_storage_ptr__,char *envName,char *defaultRelativePath)

{
  char *__s;
  string *psVar1;
  long *plVar2;
  string *extraout_RAX;
  runtime_error *this;
  long *plVar3;
  char buffer [200];
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  string *local_118 [2];
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  long local_e8;
  long lStack_e0;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = getenv(envName);
  if (__s == (char *)0x0) {
    sago::internal::getHome_abi_cxx11_();
    plVar2 = (long *)std::__cxx11::string::append((char *)local_118);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_128 = *plVar3;
      lStack_120 = plVar2[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar3;
      local_138 = (long *)*plVar2;
    }
    local_130 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_e8 = *plVar3;
      lStack_e0 = plVar2[3];
      local_f8._M_allocated_capacity = (size_type)&local_e8;
    }
    else {
      local_e8 = *plVar3;
      local_f8._M_allocated_capacity = (size_type)(long *)*plVar2;
    }
    local_f8._8_8_ = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_108 + 0x10));
    if ((long *)local_f8._M_allocated_capacity != &local_e8) {
      operator_delete((void *)local_f8._M_allocated_capacity,local_e8 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    psVar1 = (string *)local_108;
    if (local_118[0] != psVar1) {
      operator_delete(local_118[0],(ulong)(local_108._0_8_ + 1));
      psVar1 = extraout_RAX;
    }
  }
  else {
    if (*__s != '/') {
      snprintf(local_108 + 0x10,200,
               "Environment \"%s\" does not start with an \'/\'. XDG specifies that the value must be absolute. The current value is: \"%s\""
               ,envName,__s);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,local_108 + 0x10);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    strlen(__s);
    psVar1 = (string *)
             std::__cxx11::string::_M_replace
                       ((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)__s);
  }
  return psVar1;
}

Assistant:

static std::string getLinuxFolderDefault(const char* envName, const char* defaultRelativePath) {
	std::string res;
	const char* tempRes = std::getenv(envName);
	if (tempRes) {
		throwOnRelative(envName, tempRes);
		res = tempRes;
		return res;
	}
	res = sago::internal::getHome() + "/" + defaultRelativePath;
	return res;
}